

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableBase.cpp
# Opt level: O2

void __thiscall adios2::core::VariableBase::SetSelection(VariableBase *this,Box<Dims> *boxDims)

{
  ShapeID SVar1;
  long lVar2;
  allocator local_bb;
  allocator local_ba;
  allocator local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  string local_58;
  string local_38;
  
  SVar1 = this->m_ShapeID;
  if (SVar1 != GlobalArray && this->m_Type == String) {
    std::__cxx11::string::string((string *)&local_38,"Core",&local_b9);
    std::__cxx11::string::string((string *)&local_58,"VariableBase",&local_ba);
    std::__cxx11::string::string((string *)&local_78,"SetSelection",&local_bb);
    std::operator+(&local_b8,"string variable ",&this->m_Name);
    std::operator+(&local_98,&local_b8,
                   " not a GlobalArray, it can\'t have a selection, in call to SetSelection");
    helper::Throw<std::invalid_argument>(&local_38,&local_58,&local_78,&local_98,-1);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
    SVar1 = this->m_ShapeID;
  }
  if ((this->m_SingleValue == true) && (SVar1 != GlobalArray)) {
    std::__cxx11::string::string((string *)&local_38,"Core",&local_b9);
    std::__cxx11::string::string((string *)&local_58,"VariableBase",&local_ba);
    std::__cxx11::string::string((string *)&local_78,"SetSelection",&local_bb);
    std::operator+(&local_b8,"selection is not valid for single value variable ",&this->m_Name);
    std::operator+(&local_98,&local_b8,", in call to SetSelection");
    helper::Throw<std::invalid_argument>(&local_38,&local_58,&local_78,&local_98,-1);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  if (this->m_ConstantDims == true) {
    std::__cxx11::string::string((string *)&local_38,"Core",&local_b9);
    std::__cxx11::string::string((string *)&local_58,"VariableBase",&local_ba);
    std::__cxx11::string::string((string *)&local_78,"SetSelection",&local_bb);
    std::operator+(&local_b8,"selection is not valid for constant shape variable ",&this->m_Name);
    std::operator+(&local_98,&local_b8,", in call to SetSelection");
    helper::Throw<std::invalid_argument>(&local_38,&local_58,&local_78,&local_98,-1);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  SVar1 = this->m_ShapeID;
  if (SVar1 == GlobalArray) {
    lVar2 = (long)(this->m_Shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->m_Shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    if ((lVar2 == (long)(boxDims->second).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(boxDims->second).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start) &&
       (lVar2 == (long)(boxDims->first).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(boxDims->first).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start)) goto LAB_00453516;
    std::__cxx11::string::string((string *)&local_38,"Core",&local_b9);
    std::__cxx11::string::string((string *)&local_58,"VariableBase",&local_ba);
    std::__cxx11::string::string((string *)&local_78,"SetSelection",&local_bb);
    std::operator+(&local_b8,"count and start must be the same size as shape for variable ",
                   &this->m_Name);
    std::operator+(&local_98,&local_b8,", in call to SetSelection");
    helper::Throw<std::invalid_argument>(&local_38,&local_58,&local_78,&local_98,-1);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
    SVar1 = this->m_ShapeID;
  }
  if ((SVar1 == JoinedArray) &&
     ((boxDims->first).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (boxDims->first).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    std::__cxx11::string::string((string *)&local_38,"Core",&local_b9);
    std::__cxx11::string::string((string *)&local_58,"VariableBase",&local_ba);
    std::__cxx11::string::string((string *)&local_78,"SetSelection",&local_bb);
    std::operator+(&local_b8,"start argument must be empty for joined array variable ",&this->m_Name
                  );
    std::operator+(&local_98,&local_b8,", in call to SetSelection");
    helper::Throw<std::invalid_argument>(&local_38,&local_58,&local_78,&local_98,-1);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
LAB_00453516:
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&this->m_Start,&boxDims->first);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&this->m_Count,&boxDims->second);
  this->m_SelectionType = BoundingBox;
  return;
}

Assistant:

void VariableBase::SetSelection(const Box<Dims> &boxDims)
{
    const Dims &start = boxDims.first;
    const Dims &count = boxDims.second;

    if (m_Type == helper::GetDataType<std::string>() && m_ShapeID != ShapeID::GlobalArray)
    {
        helper::Throw<std::invalid_argument>("Core", "VariableBase", "SetSelection",
                                             "string variable " + m_Name +
                                                 " not a GlobalArray, it can't have a "
                                                 "selection, in call to SetSelection");
    }

    if (m_SingleValue && m_ShapeID != ShapeID::GlobalArray)
    {
        helper::Throw<std::invalid_argument>("Core", "VariableBase", "SetSelection",
                                             "selection is not valid for single value variable " +
                                                 m_Name + ", in call to SetSelection");
    }

    if (m_ConstantDims)
    {
        helper::Throw<std::invalid_argument>("Core", "VariableBase", "SetSelection",
                                             "selection is not valid for constant shape variable " +
                                                 m_Name + ", in call to SetSelection");
    }

    if (m_ShapeID == ShapeID::GlobalArray &&
        (m_Shape.size() != count.size() || m_Shape.size() != start.size()))
    {
        helper::Throw<std::invalid_argument>("Core", "VariableBase", "SetSelection",
                                             "count and start must be the "
                                             "same size as shape for variable " +
                                                 m_Name + ", in call to SetSelection");
    }

    if (m_ShapeID == ShapeID::JoinedArray && !start.empty())
    {
        helper::Throw<std::invalid_argument>("Core", "VariableBase", "SetSelection",
                                             "start argument must be empty "
                                             "for joined array variable " +
                                                 m_Name + ", in call to SetSelection");
    }

    m_Start = start;
    m_Count = count;
    m_SelectionType = SelectionType::BoundingBox;
#if defined(ADIOS2_HAVE_KOKKOS) || defined(ADIOS2_HAVE_GPU_SUPPORT)
    UpdateLayout(m_Count);
    UpdateLayout(m_Start);
#endif
}